

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall
flatbuffers::ts::TsGenerator::GenerateFinisher
          (TsGenerator *this,StructDef *struct_def,string *code_ptr,string *code,bool size_prefixed)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  byte local_ea;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50 [8];
  string sizePrefixed;
  bool size_prefixed_local;
  string *code_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  TsGenerator *this_local;
  
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ == struct_def) {
    sizePrefixed.field_2._M_local_buf[0xf] = size_prefixed;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"SizePrefixed",&local_51);
    std::allocator<char>::~allocator(&local_51);
    GenDocComment(code_ptr);
    local_ea = 0;
    if ((sizePrefixed.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      local_ea = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
    }
    else {
      std::__cxx11::string::string((string *)&local_e8,local_50);
    }
    std::operator+(&local_c8,"static finish",&local_e8);
    GetPrefixedName_abi_cxx11_(&local_110,this,struct_def,"");
    std::operator+(&local_a8,&local_c8,&local_110);
    std::operator+(&local_88,&local_a8,"Buffer");
    std::__cxx11::string::operator+=((string *)code,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((local_ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_e9);
    }
    std::__cxx11::string::operator+=
              ((string *)code,"(builder:flatbuffers.Builder, offset:flatbuffers.Offset) {\n");
    std::__cxx11::string::operator+=((string *)code,"  builder.finish(offset");
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_150,", \'",&((this->super_BaseGenerator).parser_)->file_identifier_);
      std::operator+(&local_130,&local_150,"\'");
      std::__cxx11::string::operator+=((string *)code,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
    if ((sizePrefixed.field_2._M_local_buf[0xf] & 1U) != 0) {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)code,", undefined");
      }
      std::__cxx11::string::operator+=((string *)code,", true");
    }
    std::__cxx11::string::operator+=((string *)code,");\n");
    std::__cxx11::string::operator+=((string *)code,"}\n\n");
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void GenerateFinisher(StructDef &struct_def, std::string *code_ptr,
                        std::string &code, bool size_prefixed) {
    if (parser_.root_struct_def_ == &struct_def) {
      std::string sizePrefixed("SizePrefixed");
      GenDocComment(code_ptr);

      code += "static finish" + (size_prefixed ? sizePrefixed : "") +
              GetPrefixedName(struct_def) + "Buffer";
      code += "(builder:flatbuffers.Builder, offset:flatbuffers.Offset) {\n";
      code += "  builder.finish(offset";
      if (!parser_.file_identifier_.empty()) {
        code += ", '" + parser_.file_identifier_ + "'";
      }
      if (size_prefixed) {
        if (parser_.file_identifier_.empty()) { code += ", undefined"; }
        code += ", true";
      }
      code += ");\n";
      code += "}\n\n";
    }
  }